

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

mat4 * __thiscall Camera::get_projection(mat4 *__return_storage_ptr__,Camera *this,float aspect)

{
  float fVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = aspect + -1.1920929e-07;
  uVar2 = -(uint)(-fVar4 <= fVar4);
  if (0.0 < (float)(~uVar2 & (uint)-fVar4 | (uint)fVar4 & uVar2)) {
    fVar4 = this->z_near;
    fVar1 = this->z_far;
    fVar3 = tanf(this->FoV * 0.017453292 * 0.5);
    __return_storage_ptr__->value[1].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    __return_storage_ptr__->value[1].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    *(undefined8 *)&__return_storage_ptr__->value[1].field_3 = 0;
    __return_storage_ptr__->value[2].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    __return_storage_ptr__->value[2].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    *(undefined8 *)&__return_storage_ptr__->value[2].field_3 = 0;
    __return_storage_ptr__->value[3].field_0 =
         (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    __return_storage_ptr__->value[3].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    __return_storage_ptr__->value[3].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    __return_storage_ptr__->value[3].field_3 =
         (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    __return_storage_ptr__->value[0].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    __return_storage_ptr__->value[0].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    *(undefined8 *)&__return_storage_ptr__->value[0].field_3 = 0;
    __return_storage_ptr__->value[0].field_0.x = 1.0 / (aspect * fVar3);
    __return_storage_ptr__->value[1].field_1.y = 1.0 / fVar3;
    __return_storage_ptr__->value[2].field_2.z = -(fVar4 + fVar1) / (fVar1 - fVar4);
    __return_storage_ptr__->value[2].field_3.w = -1.0;
    __return_storage_ptr__->value[3].field_2.z = (fVar1 * -2.0 * fVar4) / (fVar1 - fVar4);
    return __return_storage_ptr__;
  }
  __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glm/glm/gtx/../gtc/../ext/matrix_clip_space.inl"
                ,0xfb,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
}

Assistant:

glm::mat4 Camera::get_projection(float aspect) {
    // std::cout << FoV << std::endl;
    return glm::perspective(
        glm::radians(FoV),
        aspect,
        z_near,
        z_far
    );
}